

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_a<ncnn::BinaryOp_x86_avx_functor::binary_op_pow>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  int in_ECX;
  undefined8 *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  __m128 _outp_2;
  __m128 _b_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m128 _b1;
  __m128 _b0;
  __m256 _p_256;
  __m128 _p_1;
  int i_1;
  __m256 _outp;
  __m256 _b;
  __m256 _p;
  int i;
  binary_op_pow op;
  __m256 pow2n_1;
  __m256 y_3;
  __m256 mask_3;
  __m256 one_3;
  __m256i imm0_3;
  __m256 fx_1;
  __m256 tmp_3;
  __m256 pow2n;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx;
  __m256 tmp_1;
  __m256 y_2;
  __m256 z_1;
  __m256 tmp_2;
  __m256 mask_2;
  __m256 e_1;
  __m256 invalid_mask_1;
  __m256 one_2;
  __m256i imm0_2;
  __m256 y;
  __m256 z;
  __m256 tmp;
  __m256 mask;
  __m256 e;
  __m256 invalid_mask;
  __m256 one;
  __m256i imm0;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_17;
  imm_xmm_union u_16;
  imm_xmm_union u_15;
  __m256i ret_6;
  __m128i y2_3;
  __m128i y1_3;
  __m128i x2_6;
  __m128i x1_6;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_19;
  imm_xmm_union u_18;
  __m256i ret_7;
  __m128i x2_7;
  __m128i x1_7;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_11;
  imm_xmm_union u_10;
  __m256i ret_4;
  __m128i x2_4;
  __m128i x1_4;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  __m256i ret_1;
  __m128i y2;
  __m128i y1;
  __m128i x2_1;
  __m128i x1_1;
  imm_xmm_union u_14;
  imm_xmm_union u_13;
  imm_xmm_union u_12;
  __m256i ret_5;
  __m128i y2_2;
  __m128i y1_2;
  __m128i x2_5;
  __m128i x1_5;
  v4sf pow2n_2;
  v4sf y_5;
  v4sf mask_5;
  v4sf one_5;
  v4si emm0_1;
  v4sf fx_2;
  v4sf tmp_5;
  v4sf y_4;
  v4sf z_2;
  v4sf tmp_4;
  v4sf mask_4;
  v4sf e_2;
  v4sf invalid_mask_2;
  v4sf one_4;
  v4si emm0;
  int local_4284;
  int local_4210;
  undefined8 *local_4200;
  float *local_41f8;
  float local_3fe0;
  float fStack_3fdc;
  float fStack_3fd8;
  float fStack_3fd4;
  float fStack_3fd0;
  float fStack_3fcc;
  float fStack_3fc8;
  float local_3fc0;
  float fStack_3fbc;
  float fStack_3fb8;
  float fStack_3fb4;
  float fStack_3fb0;
  float fStack_3fac;
  float fStack_3fa8;
  undefined4 uStack_3fa4;
  float local_3f60;
  float fStack_3f5c;
  float fStack_3f58;
  float fStack_3f54;
  float fStack_3f50;
  float fStack_3f4c;
  float fStack_3f48;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined8 local_3ea0;
  undefined8 uStack_3e98;
  undefined8 uStack_3e90;
  undefined8 uStack_3e88;
  undefined1 local_3e80 [8];
  float fStack_3e78;
  float fStack_3e74;
  float fStack_3e70;
  float fStack_3e6c;
  float fStack_3e68;
  undefined4 uStack_3e64;
  undefined1 local_3e40 [8];
  float fStack_3e38;
  float fStack_3e34;
  undefined8 uStack_3e30;
  undefined8 uStack_3e28;
  float local_3da0;
  float fStack_3d9c;
  float fStack_3d98;
  float fStack_3d94;
  float fStack_3d90;
  float fStack_3d8c;
  float fStack_3d88;
  float local_3d40;
  float fStack_3d3c;
  float fStack_3d38;
  float fStack_3d34;
  float fStack_3d30;
  float fStack_3d2c;
  float fStack_3d28;
  float fStack_3d24;
  undefined8 local_3c80;
  undefined8 uStack_3c78;
  undefined8 uStack_3c70;
  undefined8 uStack_3c68;
  undefined8 local_3c20;
  undefined8 uStack_3c18;
  undefined8 uStack_3c10;
  undefined8 uStack_3c08;
  undefined1 local_3c00 [8];
  float fStack_3bf8;
  float fStack_3bf4;
  float fStack_3bf0;
  float fStack_3bec;
  float fStack_3be8;
  undefined4 uStack_3be4;
  undefined1 local_3bc0 [8];
  float fStack_3bb8;
  float fStack_3bb4;
  undefined8 uStack_3bb0;
  undefined8 uStack_3ba8;
  float local_3b20;
  float fStack_3b1c;
  float fStack_3b18;
  float fStack_3b14;
  float fStack_3b10;
  float fStack_3b0c;
  float fStack_3b08;
  float local_3ac0;
  float fStack_3abc;
  float fStack_3ab8;
  float fStack_3ab4;
  float fStack_3ab0;
  float fStack_3aac;
  float fStack_3aa8;
  float fStack_3aa4;
  undefined1 local_3a20 [8];
  float fStack_3a18;
  float fStack_3a14;
  float fStack_3a10;
  float fStack_3a0c;
  float fStack_3a08;
  float fStack_3a04;
  undefined1 local_39a0 [8];
  float fStack_3998;
  float fStack_3994;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  undefined1 local_3920 [8];
  float fStack_3918;
  float fStack_3914;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  float local_3900;
  float fStack_38fc;
  float fStack_38f8;
  float fStack_38f4;
  float fStack_38f0;
  float fStack_38ec;
  float fStack_38e8;
  float fStack_38e4;
  float local_38c0;
  float fStack_38bc;
  float fStack_38b8;
  float fStack_38b4;
  float fStack_38b0;
  float fStack_38ac;
  float fStack_38a8;
  float fStack_38a4;
  float local_38a0;
  float fStack_389c;
  float fStack_3898;
  float fStack_3894;
  float fStack_3890;
  float fStack_388c;
  float fStack_3888;
  float fStack_3884;
  float local_3860;
  float fStack_385c;
  float fStack_3858;
  float fStack_3854;
  float fStack_3850;
  float fStack_384c;
  float fStack_3848;
  float fStack_3844;
  undefined1 local_36c0 [8];
  float fStack_36b8;
  float fStack_36b4;
  float fStack_36b0;
  float fStack_36ac;
  float fStack_36a8;
  float fStack_36a4;
  undefined1 local_3640 [8];
  float fStack_3638;
  float fStack_3634;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined1 local_35c0 [8];
  float fStack_35b8;
  float fStack_35b4;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  float local_35a0;
  float fStack_359c;
  float fStack_3598;
  float fStack_3594;
  float fStack_3590;
  float fStack_358c;
  float fStack_3588;
  float fStack_3584;
  float local_3560;
  float fStack_355c;
  float fStack_3558;
  float fStack_3554;
  float fStack_3550;
  float fStack_354c;
  float fStack_3548;
  float fStack_3544;
  float local_3540;
  float fStack_353c;
  float fStack_3538;
  float fStack_3534;
  float fStack_3530;
  float fStack_352c;
  float fStack_3528;
  float fStack_3524;
  float local_3500;
  float fStack_34fc;
  float fStack_34f8;
  float fStack_34f4;
  float fStack_34f0;
  float fStack_34ec;
  float fStack_34e8;
  float fStack_34e4;
  float local_31c0;
  float fStack_31bc;
  float fStack_31b8;
  float fStack_31b4;
  float fStack_31b0;
  float fStack_31ac;
  float fStack_31a8;
  float local_2b80;
  float fStack_2b7c;
  float fStack_2b78;
  float fStack_2b74;
  float fStack_2b70;
  float fStack_2b6c;
  float fStack_2b68;
  float local_2220;
  float fStack_221c;
  float fStack_2218;
  float fStack_2214;
  float fStack_2210;
  float fStack_220c;
  float fStack_2208;
  float local_1dc0;
  float fStack_1dbc;
  float fStack_1db8;
  float fStack_1db4;
  float fStack_1db0;
  float fStack_1dac;
  float fStack_1da8;
  float local_1940;
  float fStack_193c;
  float fStack_1938;
  float fStack_1934;
  float fStack_1930;
  float fStack_192c;
  float fStack_1928;
  float fStack_1924;
  float local_1800;
  float fStack_17fc;
  float fStack_17f8;
  float fStack_17f4;
  float fStack_17f0;
  float fStack_17ec;
  float fStack_17e8;
  float fStack_17e4;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 local_e80;
  undefined8 uStack_e78;
  float local_cc0;
  float fStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 local_c50;
  undefined8 uStack_c48;
  undefined8 local_c30;
  undefined8 uStack_c28;
  float local_bc0;
  float fStack_bbc;
  float fStack_bb8;
  float fStack_bb4;
  float local_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  float local_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a60;
  undefined8 uStack_a58;
  float local_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  float local_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  
  local_4200 = in_RDX;
  local_41f8 = in_RSI;
  if (in_R8D == 8) {
    local_4210 = 0;
    auVar3 = *in_RDI;
    auVar7 = *in_RDI;
    for (; local_4210 < in_ECX; local_4210 = local_4210 + 1) {
      fVar67 = *local_41f8;
      auVar4 = vinsertps_avx(ZEXT416((uint)fVar67),ZEXT416((uint)fVar67),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar67),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar67),0x30);
      auVar5 = vinsertps_avx(ZEXT416((uint)fVar67),ZEXT416((uint)fVar67),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar67),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar67),0x30);
      auVar1 = vcmpps_avx(auVar7,ZEXT1632(ZEXT816(0)),2);
      auVar8._8_8_ = 0x80000000800000;
      auVar8._0_8_ = 0x80000000800000;
      auVar8._16_8_ = 0x80000000800000;
      auVar8._24_8_ = 0x80000000800000;
      auVar6 = vmaxps_avx(auVar3,auVar8);
      auVar9 = vpsrld_avx(auVar6._0_16_,ZEXT416(0x17));
      auVar10 = vpsrld_avx(auVar6._16_16_,ZEXT416(0x17));
      auVar22._8_8_ = 0x807fffff807fffff;
      auVar22._0_8_ = 0x807fffff807fffff;
      auVar22._16_8_ = 0x807fffff807fffff;
      auVar22._24_8_ = 0x807fffff807fffff;
      auVar6 = vandps_avx(auVar6,auVar22);
      auVar38._8_8_ = 0x3f0000003f000000;
      auVar38._0_8_ = 0x3f0000003f000000;
      auVar38._16_8_ = 0x3f0000003f000000;
      auVar38._24_8_ = 0x3f0000003f000000;
      auVar8 = vorps_avx(auVar6,auVar38);
      auVar12._8_8_ = 0x7f0000007f;
      auVar12._0_8_ = 0x7f0000007f;
      auVar9 = vpsubd_avx(auVar9,auVar12);
      auVar11._8_8_ = 0x7f0000007f;
      auVar11._0_8_ = 0x7f0000007f;
      auVar10 = vpsubd_avx(auVar10,auVar11);
      local_f80 = auVar10._0_8_;
      uStack_f78 = auVar10._8_8_;
      auVar41._16_8_ = local_f80;
      auVar41._0_16_ = auVar9;
      auVar41._24_8_ = uStack_f78;
      auVar6 = vcvtdq2ps_avx(auVar41);
      local_3500 = auVar6._0_4_;
      fStack_34fc = auVar6._4_4_;
      fStack_34f8 = auVar6._8_4_;
      fStack_34f4 = auVar6._12_4_;
      fStack_34f0 = auVar6._16_4_;
      fStack_34ec = auVar6._20_4_;
      fStack_34e8 = auVar6._24_4_;
      fStack_34e4 = auVar6._28_4_;
      local_3640._4_4_ = fStack_34fc + 1.0;
      local_3640._0_4_ = local_3500 + 1.0;
      fStack_3638 = fStack_34f8 + 1.0;
      fStack_3634 = fStack_34f4 + 1.0;
      uStack_3630._0_4_ = fStack_34f0 + 1.0;
      uStack_3630._4_4_ = fStack_34ec + 1.0;
      uStack_3628._0_4_ = fStack_34e8 + 1.0;
      uStack_3628._4_4_ = fStack_34e4 + 1.0;
      auVar19 = _local_3640;
      auVar2 = vcmpps_avx(auVar8,_DAT_01f8f6e0,1);
      auVar6 = vandps_avx(auVar8,auVar2);
      auVar20._8_8_ = 0x3f8000003f800000;
      auVar20._0_8_ = 0x3f8000003f800000;
      auVar20._16_8_ = 0x3f8000003f800000;
      auVar20._24_8_ = 0x3f8000003f800000;
      auVar8 = vsubps_avx(auVar8,auVar20);
      uStack_3628 = auVar19._24_8_;
      auVar21._8_8_ = 0x3f8000003f800000;
      auVar21._0_8_ = 0x3f8000003f800000;
      auVar21._16_8_ = 0x3f8000003f800000;
      auVar21._24_8_ = 0x3f8000003f800000;
      auVar2 = vandps_avx(auVar21,auVar2);
      auVar19._16_8_ = uStack_3630;
      auVar19._0_16_ = _local_3640;
      auVar19._24_8_ = uStack_3628;
      auVar2 = vsubps_avx(auVar19,auVar2);
      local_3540 = auVar8._0_4_;
      fStack_353c = auVar8._4_4_;
      fStack_3538 = auVar8._8_4_;
      fStack_3534 = auVar8._12_4_;
      fStack_3530 = auVar8._16_4_;
      fStack_352c = auVar8._20_4_;
      fStack_3528 = auVar8._24_4_;
      fStack_3524 = auVar8._28_4_;
      local_3560 = auVar6._0_4_;
      fStack_355c = auVar6._4_4_;
      fStack_3558 = auVar6._8_4_;
      fStack_3554 = auVar6._12_4_;
      fStack_3550 = auVar6._16_4_;
      fStack_354c = auVar6._20_4_;
      fStack_3548 = auVar6._24_4_;
      fStack_3544 = auVar6._28_4_;
      local_3540 = local_3540 + local_3560;
      fStack_353c = fStack_353c + fStack_355c;
      fStack_3538 = fStack_3538 + fStack_3558;
      fStack_3534 = fStack_3534 + fStack_3554;
      fStack_3530 = fStack_3530 + fStack_3550;
      fStack_352c = fStack_352c + fStack_354c;
      fStack_3528 = fStack_3528 + fStack_3548;
      fStack_3524 = fStack_3524 + fStack_3544;
      local_31c0 = auVar2._0_4_;
      fStack_31bc = auVar2._4_4_;
      fStack_31b8 = auVar2._8_4_;
      fStack_31b4 = auVar2._12_4_;
      fStack_31b0 = auVar2._16_4_;
      fStack_31ac = auVar2._20_4_;
      fStack_31a8 = auVar2._24_4_;
      local_36c0._4_4_ =
           fStack_31bc * -0.00021219444 +
           ((((((((fStack_353c * 0.070376836 + -0.1151461) * fStack_353c + 0.116769984) *
                 fStack_353c + -0.12420141) * fStack_353c + 0.14249323) * fStack_353c + -0.16668057)
              * fStack_353c + 0.20000714) * fStack_353c + -0.24999994) * fStack_353c + 0.3333333) *
           fStack_353c * fStack_353c * fStack_353c;
      local_36c0._0_4_ =
           local_31c0 * -0.00021219444 +
           ((((((((local_3540 * 0.070376836 + -0.1151461) * local_3540 + 0.116769984) * local_3540 +
                -0.12420141) * local_3540 + 0.14249323) * local_3540 + -0.16668057) * local_3540 +
             0.20000714) * local_3540 + -0.24999994) * local_3540 + 0.3333333) * local_3540 *
           local_3540 * local_3540;
      fStack_36b8 = fStack_31b8 * -0.00021219444 +
                    ((((((((fStack_3538 * 0.070376836 + -0.1151461) * fStack_3538 + 0.116769984) *
                          fStack_3538 + -0.12420141) * fStack_3538 + 0.14249323) * fStack_3538 +
                       -0.16668057) * fStack_3538 + 0.20000714) * fStack_3538 + -0.24999994) *
                     fStack_3538 + 0.3333333) * fStack_3538 * fStack_3538 * fStack_3538;
      fStack_36b4 = fStack_31b4 * -0.00021219444 +
                    ((((((((fStack_3534 * 0.070376836 + -0.1151461) * fStack_3534 + 0.116769984) *
                          fStack_3534 + -0.12420141) * fStack_3534 + 0.14249323) * fStack_3534 +
                       -0.16668057) * fStack_3534 + 0.20000714) * fStack_3534 + -0.24999994) *
                     fStack_3534 + 0.3333333) * fStack_3534 * fStack_3534 * fStack_3534;
      fStack_36b0 = fStack_31b0 * -0.00021219444 +
                    ((((((((fStack_3530 * 0.070376836 + -0.1151461) * fStack_3530 + 0.116769984) *
                          fStack_3530 + -0.12420141) * fStack_3530 + 0.14249323) * fStack_3530 +
                       -0.16668057) * fStack_3530 + 0.20000714) * fStack_3530 + -0.24999994) *
                     fStack_3530 + 0.3333333) * fStack_3530 * fStack_3530 * fStack_3530;
      fStack_36ac = fStack_31ac * -0.00021219444 +
                    ((((((((fStack_352c * 0.070376836 + -0.1151461) * fStack_352c + 0.116769984) *
                          fStack_352c + -0.12420141) * fStack_352c + 0.14249323) * fStack_352c +
                       -0.16668057) * fStack_352c + 0.20000714) * fStack_352c + -0.24999994) *
                     fStack_352c + 0.3333333) * fStack_352c * fStack_352c * fStack_352c;
      fStack_36a8 = fStack_31a8 * -0.00021219444 +
                    ((((((((fStack_3528 * 0.070376836 + -0.1151461) * fStack_3528 + 0.116769984) *
                          fStack_3528 + -0.12420141) * fStack_3528 + 0.14249323) * fStack_3528 +
                       -0.16668057) * fStack_3528 + 0.20000714) * fStack_3528 + -0.24999994) *
                     fStack_3528 + 0.3333333) * fStack_3528 * fStack_3528 * fStack_3528;
      fStack_36a4 = fStack_3524 + 0.3333333 + -0.00021219444;
      auVar27._4_4_ = fStack_353c * fStack_353c * 0.5;
      auVar27._0_4_ = local_3540 * local_3540 * 0.5;
      auVar27._8_4_ = fStack_3538 * fStack_3538 * 0.5;
      auVar27._12_4_ = fStack_3534 * fStack_3534 * 0.5;
      auVar27._16_4_ = fStack_3530 * fStack_3530 * 0.5;
      auVar27._20_4_ = fStack_352c * fStack_352c * 0.5;
      auVar27._24_4_ = fStack_3528 * fStack_3528 * 0.5;
      auVar27._28_4_ = fStack_3524;
      auVar6 = vsubps_avx(_local_36c0,auVar27);
      local_35a0 = auVar6._0_4_;
      fStack_359c = auVar6._4_4_;
      fStack_3598 = auVar6._8_4_;
      fStack_3594 = auVar6._12_4_;
      fStack_3590 = auVar6._16_4_;
      fStack_358c = auVar6._20_4_;
      fStack_3588 = auVar6._24_4_;
      fStack_3584 = auVar6._28_4_;
      local_35c0._4_4_ = fStack_31bc * 0.6933594 + fStack_353c + fStack_359c;
      local_35c0._0_4_ = local_31c0 * 0.6933594 + local_3540 + local_35a0;
      fStack_35b8 = fStack_31b8 * 0.6933594 + fStack_3538 + fStack_3598;
      fStack_35b4 = fStack_31b4 * 0.6933594 + fStack_3534 + fStack_3594;
      uStack_35b0._0_4_ = fStack_31b0 * 0.6933594 + fStack_3530 + fStack_3590;
      uStack_35b0._4_4_ = fStack_31ac * 0.6933594 + fStack_352c + fStack_358c;
      uStack_35a8._0_4_ = fStack_31a8 * 0.6933594 + fStack_3528 + fStack_3588;
      uStack_35a8._4_4_ = fStack_3524 + fStack_3584 + 0.6933594;
      auVar6 = _local_35c0;
      uStack_35a8 = auVar6._24_8_;
      auVar37._16_8_ = uStack_35b0;
      auVar37._0_16_ = _local_35c0;
      auVar37._24_8_ = uStack_35a8;
      auVar6 = vorps_avx(auVar37,auVar1);
      local_3fc0 = auVar4._0_4_;
      fStack_3fbc = auVar4._4_4_;
      fStack_3fb8 = auVar4._8_4_;
      fStack_3fb4 = auVar4._12_4_;
      fStack_3fb0 = auVar5._0_4_;
      fStack_3fac = auVar5._4_4_;
      fStack_3fa8 = auVar5._8_4_;
      uStack_3fa4 = auVar5._12_4_;
      local_3fe0 = auVar6._0_4_;
      fStack_3fdc = auVar6._4_4_;
      fStack_3fd8 = auVar6._8_4_;
      fStack_3fd4 = auVar6._12_4_;
      fStack_3fd0 = auVar6._16_4_;
      fStack_3fcc = auVar6._20_4_;
      fStack_3fc8 = auVar6._24_4_;
      local_3bc0._4_4_ = fStack_3fbc * fStack_3fdc;
      local_3bc0._0_4_ = local_3fc0 * local_3fe0;
      fStack_3bb8 = fStack_3fb8 * fStack_3fd8;
      fStack_3bb4 = fStack_3fb4 * fStack_3fd4;
      uStack_3bb0._0_4_ = fStack_3fb0 * fStack_3fd0;
      uStack_3bb0._4_4_ = fStack_3fac * fStack_3fcc;
      uStack_3ba8._0_4_ = fStack_3fa8 * fStack_3fc8;
      uStack_3ba8._4_4_ = uStack_3fa4;
      auVar6 = _local_3bc0;
      uStack_3ba8 = auVar6._24_8_;
      auVar1._16_8_ = uStack_3bb0;
      auVar1._0_16_ = _local_3bc0;
      auVar1._24_8_ = uStack_3ba8;
      auVar6._8_8_ = 0x42b0c0a542b0c0a5;
      auVar6._0_8_ = 0x42b0c0a542b0c0a5;
      auVar6._16_8_ = 0x42b0c0a542b0c0a5;
      auVar6._24_8_ = 0x42b0c0a542b0c0a5;
      auVar6 = vminps_avx(auVar1,auVar6);
      auVar2._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar2._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar2._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar2._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar2 = vmaxps_avx(auVar6,auVar2);
      local_2220 = auVar2._0_4_;
      fStack_221c = auVar2._4_4_;
      fStack_2218 = auVar2._8_4_;
      fStack_2214 = auVar2._12_4_;
      fStack_2210 = auVar2._16_4_;
      fStack_220c = auVar2._20_4_;
      fStack_2208 = auVar2._24_4_;
      local_3c00._4_4_ = fStack_221c * 1.442695 + 0.5;
      local_3c00._0_4_ = local_2220 * 1.442695 + 0.5;
      fStack_3bf8 = fStack_2218 * 1.442695 + 0.5;
      fStack_3bf4 = fStack_2214 * 1.442695 + 0.5;
      fStack_3bf0 = fStack_2210 * 1.442695 + 0.5;
      fStack_3bec = fStack_220c * 1.442695 + 0.5;
      fStack_3be8 = fStack_2208 * 1.442695 + 0.5;
      uStack_3be4 = 0x3ff8aa3b;
      auVar1 = vroundps_avx(_local_3c00,1);
      auVar6 = vcmpps_avx(_local_3c00,auVar1,1);
      auVar25._8_8_ = 0x3f8000003f800000;
      auVar25._0_8_ = 0x3f8000003f800000;
      auVar25._16_8_ = 0x3f8000003f800000;
      auVar25._24_8_ = 0x3f8000003f800000;
      auVar6 = vandps_avx(auVar6,auVar25);
      auVar6 = vsubps_avx(auVar1,auVar6);
      local_1940 = auVar6._0_4_;
      fStack_193c = auVar6._4_4_;
      fStack_1938 = auVar6._8_4_;
      fStack_1934 = auVar6._12_4_;
      fStack_1930 = auVar6._16_4_;
      fStack_192c = auVar6._20_4_;
      fStack_1928 = auVar6._24_4_;
      fStack_1924 = auVar6._28_4_;
      auVar30._4_4_ = fStack_193c * 0.6933594;
      auVar30._0_4_ = local_1940 * 0.6933594;
      auVar30._8_4_ = fStack_1938 * 0.6933594;
      auVar30._12_4_ = fStack_1934 * 0.6933594;
      auVar30._16_4_ = fStack_1930 * 0.6933594;
      auVar30._20_4_ = fStack_192c * 0.6933594;
      auVar30._24_4_ = fStack_1928 * 0.6933594;
      auVar30._28_4_ = fStack_1924;
      auVar6 = vsubps_avx(auVar2,auVar30);
      auVar29._4_4_ = fStack_193c * -0.00021219444;
      auVar29._0_4_ = local_1940 * -0.00021219444;
      auVar29._8_4_ = fStack_1938 * -0.00021219444;
      auVar29._12_4_ = fStack_1934 * -0.00021219444;
      auVar29._16_4_ = fStack_1930 * -0.00021219444;
      auVar29._20_4_ = fStack_192c * -0.00021219444;
      auVar29._24_4_ = fStack_1928 * -0.00021219444;
      auVar29._28_4_ = fStack_1924;
      auVar6 = vsubps_avx(auVar6,auVar29);
      local_3ac0 = auVar6._0_4_;
      fStack_3abc = auVar6._4_4_;
      fStack_3ab8 = auVar6._8_4_;
      fStack_3ab4 = auVar6._12_4_;
      fStack_3ab0 = auVar6._16_4_;
      fStack_3aac = auVar6._20_4_;
      fStack_3aa8 = auVar6._24_4_;
      fStack_3aa4 = auVar6._28_4_;
      local_3c20 = CONCAT44((int)fStack_193c,(int)local_1940);
      uStack_3c18 = CONCAT44((int)fStack_1934,(int)fStack_1938);
      uStack_3c10 = CONCAT44((int)fStack_192c,(int)fStack_1930);
      uStack_3c08 = CONCAT44((int)fStack_1924,(int)fStack_1928);
      auVar10._8_8_ = uStack_3c18;
      auVar10._0_8_ = local_3c20;
      auVar4._8_8_ = 0x7f0000007f;
      auVar4._0_8_ = 0x7f0000007f;
      auVar4 = vpaddd_avx(auVar10,auVar4);
      auVar9._8_8_ = uStack_3c08;
      auVar9._0_8_ = uStack_3c10;
      auVar5._8_8_ = 0x7f0000007f;
      auVar5._0_8_ = 0x7f0000007f;
      auVar5 = vpaddd_avx(auVar9,auVar5);
      auVar4 = vpslld_avx(auVar4,ZEXT416(0x17));
      auVar5 = vpslld_avx(auVar5,ZEXT416(0x17));
      local_3b20 = auVar4._0_4_;
      fStack_3b1c = auVar4._4_4_;
      fStack_3b18 = auVar4._8_4_;
      fStack_3b14 = auVar4._12_4_;
      fStack_3b10 = auVar5._0_4_;
      fStack_3b0c = auVar5._4_4_;
      fStack_3b08 = auVar5._8_4_;
      local_3c80 = CONCAT44(((((((fStack_3abc * 0.00019875691 + 0.0013981999) * fStack_3abc +
                                0.008333452) * fStack_3abc + 0.041665796) * fStack_3abc + 0.16666666
                              ) * fStack_3abc + 0.5) * fStack_3abc * fStack_3abc + fStack_3abc + 1.0
                            ) * fStack_3b1c,
                            ((((((local_3ac0 * 0.00019875691 + 0.0013981999) * local_3ac0 +
                                0.008333452) * local_3ac0 + 0.041665796) * local_3ac0 + 0.16666666)
                              * local_3ac0 + 0.5) * local_3ac0 * local_3ac0 + local_3ac0 + 1.0) *
                            local_3b20);
      uStack_3c78 = CONCAT44(((((((fStack_3ab4 * 0.00019875691 + 0.0013981999) * fStack_3ab4 +
                                 0.008333452) * fStack_3ab4 + 0.041665796) * fStack_3ab4 +
                               0.16666666) * fStack_3ab4 + 0.5) * fStack_3ab4 * fStack_3ab4 +
                              fStack_3ab4 + 1.0) * fStack_3b14,
                             ((((((fStack_3ab8 * 0.00019875691 + 0.0013981999) * fStack_3ab8 +
                                 0.008333452) * fStack_3ab8 + 0.041665796) * fStack_3ab8 +
                               0.16666666) * fStack_3ab8 + 0.5) * fStack_3ab8 * fStack_3ab8 +
                              fStack_3ab8 + 1.0) * fStack_3b18);
      uStack_3c70 = CONCAT44(((((((fStack_3aac * 0.00019875691 + 0.0013981999) * fStack_3aac +
                                 0.008333452) * fStack_3aac + 0.041665796) * fStack_3aac +
                               0.16666666) * fStack_3aac + 0.5) * fStack_3aac * fStack_3aac +
                              fStack_3aac + 1.0) * fStack_3b0c,
                             ((((((fStack_3ab0 * 0.00019875691 + 0.0013981999) * fStack_3ab0 +
                                 0.008333452) * fStack_3ab0 + 0.041665796) * fStack_3ab0 +
                               0.16666666) * fStack_3ab0 + 0.5) * fStack_3ab0 * fStack_3ab0 +
                              fStack_3ab0 + 1.0) * fStack_3b10);
      uStack_3c68 = CONCAT44(fStack_3aa4 + fStack_3aa4 + 1.0,
                             ((((((fStack_3aa8 * 0.00019875691 + 0.0013981999) * fStack_3aa8 +
                                 0.008333452) * fStack_3aa8 + 0.041665796) * fStack_3aa8 +
                               0.16666666) * fStack_3aa8 + 0.5) * fStack_3aa8 * fStack_3aa8 +
                              fStack_3aa8 + 1.0) * fStack_3b08);
      *local_4200 = local_3c80;
      local_4200[1] = uStack_3c78;
      local_4200[2] = uStack_3c70;
      local_4200[3] = uStack_3c68;
      local_41f8 = local_41f8 + 1;
      local_4200 = local_4200 + 4;
    }
  }
  if (in_R8D == 4) {
    local_4284 = 0;
    uVar13 = *(undefined8 *)*in_RDI;
    uVar14 = *(undefined8 *)(*in_RDI + 8);
    auVar10 = *(undefined1 (*) [16])*in_RDI;
    auVar9 = *(undefined1 (*) [16])*in_RDI;
    auVar5 = *(undefined1 (*) [16])*in_RDI;
    auVar4 = *(undefined1 (*) [16])*in_RDI;
    for (; local_4284 + 1 < in_ECX; local_4284 = local_4284 + 2) {
      fVar67 = *local_41f8;
      uStack_3e28._4_4_ = local_41f8[1];
      auVar66._16_8_ = uVar13;
      auVar66._0_16_ = auVar5;
      auVar66._24_8_ = uVar14;
      auVar65._16_8_ = uVar13;
      auVar65._0_16_ = auVar4;
      auVar65._24_8_ = uVar14;
      auVar6 = vcmpps_avx(auVar65,ZEXT1632(ZEXT816(0)),2);
      auVar18._8_8_ = 0x80000000800000;
      auVar18._0_8_ = 0x80000000800000;
      auVar18._16_8_ = 0x80000000800000;
      auVar18._24_8_ = 0x80000000800000;
      auVar7 = vmaxps_avx(auVar66,auVar18);
      auVar11 = vpsrld_avx(auVar7._0_16_,ZEXT416(0x17));
      auVar12 = vpsrld_avx(auVar7._16_16_,ZEXT416(0x17));
      auVar24._8_8_ = 0x807fffff807fffff;
      auVar24._0_8_ = 0x807fffff807fffff;
      auVar24._16_8_ = 0x807fffff807fffff;
      auVar24._24_8_ = 0x807fffff807fffff;
      auVar7 = vandps_avx(auVar7,auVar24);
      auVar40._8_8_ = 0x3f0000003f000000;
      auVar40._0_8_ = 0x3f0000003f000000;
      auVar40._16_8_ = 0x3f0000003f000000;
      auVar40._24_8_ = 0x3f0000003f000000;
      auVar2 = vorps_avx(auVar7,auVar40);
      auVar44._8_8_ = 0x7f0000007f;
      auVar44._0_8_ = 0x7f0000007f;
      auVar11 = vpsubd_avx(auVar11,auVar44);
      auVar43._8_8_ = 0x7f0000007f;
      auVar43._0_8_ = 0x7f0000007f;
      auVar12 = vpsubd_avx(auVar12,auVar43);
      local_e80 = auVar12._0_8_;
      uStack_e78 = auVar12._8_8_;
      auVar42._16_8_ = local_e80;
      auVar42._0_16_ = auVar11;
      auVar42._24_8_ = uStack_e78;
      auVar7 = vcvtdq2ps_avx(auVar42);
      local_3860 = auVar7._0_4_;
      fStack_385c = auVar7._4_4_;
      fStack_3858 = auVar7._8_4_;
      fStack_3854 = auVar7._12_4_;
      fStack_3850 = auVar7._16_4_;
      fStack_384c = auVar7._20_4_;
      fStack_3848 = auVar7._24_4_;
      fStack_3844 = auVar7._28_4_;
      local_39a0._4_4_ = fStack_385c + 1.0;
      local_39a0._0_4_ = local_3860 + 1.0;
      fStack_3998 = fStack_3858 + 1.0;
      fStack_3994 = fStack_3854 + 1.0;
      uStack_3990._0_4_ = fStack_3850 + 1.0;
      uStack_3990._4_4_ = fStack_384c + 1.0;
      uStack_3988._0_4_ = fStack_3848 + 1.0;
      uStack_3988._4_4_ = fStack_3844 + 1.0;
      auVar1 = _local_39a0;
      auVar3 = vcmpps_avx(auVar2,_DAT_01f8f6e0,1);
      auVar7 = vandps_avx(auVar2,auVar3);
      auVar17._8_8_ = 0x3f8000003f800000;
      auVar17._0_8_ = 0x3f8000003f800000;
      auVar17._16_8_ = 0x3f8000003f800000;
      auVar17._24_8_ = 0x3f8000003f800000;
      auVar2 = vsubps_avx(auVar2,auVar17);
      uStack_3988 = auVar1._24_8_;
      auVar23._8_8_ = 0x3f8000003f800000;
      auVar23._0_8_ = 0x3f8000003f800000;
      auVar23._16_8_ = 0x3f8000003f800000;
      auVar23._24_8_ = 0x3f8000003f800000;
      auVar3 = vandps_avx(auVar23,auVar3);
      auVar16._16_8_ = uStack_3990;
      auVar16._0_16_ = _local_39a0;
      auVar16._24_8_ = uStack_3988;
      auVar3 = vsubps_avx(auVar16,auVar3);
      local_38a0 = auVar2._0_4_;
      fStack_389c = auVar2._4_4_;
      fStack_3898 = auVar2._8_4_;
      fStack_3894 = auVar2._12_4_;
      fStack_3890 = auVar2._16_4_;
      fStack_388c = auVar2._20_4_;
      fStack_3888 = auVar2._24_4_;
      fStack_3884 = auVar2._28_4_;
      local_38c0 = auVar7._0_4_;
      fStack_38bc = auVar7._4_4_;
      fStack_38b8 = auVar7._8_4_;
      fStack_38b4 = auVar7._12_4_;
      fStack_38b0 = auVar7._16_4_;
      fStack_38ac = auVar7._20_4_;
      fStack_38a8 = auVar7._24_4_;
      fStack_38a4 = auVar7._28_4_;
      local_38a0 = local_38a0 + local_38c0;
      fStack_389c = fStack_389c + fStack_38bc;
      fStack_3898 = fStack_3898 + fStack_38b8;
      fStack_3894 = fStack_3894 + fStack_38b4;
      fStack_3890 = fStack_3890 + fStack_38b0;
      fStack_388c = fStack_388c + fStack_38ac;
      fStack_3888 = fStack_3888 + fStack_38a8;
      fStack_3884 = fStack_3884 + fStack_38a4;
      local_2b80 = auVar3._0_4_;
      fStack_2b7c = auVar3._4_4_;
      fStack_2b78 = auVar3._8_4_;
      fStack_2b74 = auVar3._12_4_;
      fStack_2b70 = auVar3._16_4_;
      fStack_2b6c = auVar3._20_4_;
      fStack_2b68 = auVar3._24_4_;
      local_3a20._4_4_ =
           fStack_2b7c * -0.00021219444 +
           ((((((((fStack_389c * 0.070376836 + -0.1151461) * fStack_389c + 0.116769984) *
                 fStack_389c + -0.12420141) * fStack_389c + 0.14249323) * fStack_389c + -0.16668057)
              * fStack_389c + 0.20000714) * fStack_389c + -0.24999994) * fStack_389c + 0.3333333) *
           fStack_389c * fStack_389c * fStack_389c;
      local_3a20._0_4_ =
           local_2b80 * -0.00021219444 +
           ((((((((local_38a0 * 0.070376836 + -0.1151461) * local_38a0 + 0.116769984) * local_38a0 +
                -0.12420141) * local_38a0 + 0.14249323) * local_38a0 + -0.16668057) * local_38a0 +
             0.20000714) * local_38a0 + -0.24999994) * local_38a0 + 0.3333333) * local_38a0 *
           local_38a0 * local_38a0;
      fStack_3a18 = fStack_2b78 * -0.00021219444 +
                    ((((((((fStack_3898 * 0.070376836 + -0.1151461) * fStack_3898 + 0.116769984) *
                          fStack_3898 + -0.12420141) * fStack_3898 + 0.14249323) * fStack_3898 +
                       -0.16668057) * fStack_3898 + 0.20000714) * fStack_3898 + -0.24999994) *
                     fStack_3898 + 0.3333333) * fStack_3898 * fStack_3898 * fStack_3898;
      fStack_3a14 = fStack_2b74 * -0.00021219444 +
                    ((((((((fStack_3894 * 0.070376836 + -0.1151461) * fStack_3894 + 0.116769984) *
                          fStack_3894 + -0.12420141) * fStack_3894 + 0.14249323) * fStack_3894 +
                       -0.16668057) * fStack_3894 + 0.20000714) * fStack_3894 + -0.24999994) *
                     fStack_3894 + 0.3333333) * fStack_3894 * fStack_3894 * fStack_3894;
      fStack_3a10 = fStack_2b70 * -0.00021219444 +
                    ((((((((fStack_3890 * 0.070376836 + -0.1151461) * fStack_3890 + 0.116769984) *
                          fStack_3890 + -0.12420141) * fStack_3890 + 0.14249323) * fStack_3890 +
                       -0.16668057) * fStack_3890 + 0.20000714) * fStack_3890 + -0.24999994) *
                     fStack_3890 + 0.3333333) * fStack_3890 * fStack_3890 * fStack_3890;
      fStack_3a0c = fStack_2b6c * -0.00021219444 +
                    ((((((((fStack_388c * 0.070376836 + -0.1151461) * fStack_388c + 0.116769984) *
                          fStack_388c + -0.12420141) * fStack_388c + 0.14249323) * fStack_388c +
                       -0.16668057) * fStack_388c + 0.20000714) * fStack_388c + -0.24999994) *
                     fStack_388c + 0.3333333) * fStack_388c * fStack_388c * fStack_388c;
      fStack_3a08 = fStack_2b68 * -0.00021219444 +
                    ((((((((fStack_3888 * 0.070376836 + -0.1151461) * fStack_3888 + 0.116769984) *
                          fStack_3888 + -0.12420141) * fStack_3888 + 0.14249323) * fStack_3888 +
                       -0.16668057) * fStack_3888 + 0.20000714) * fStack_3888 + -0.24999994) *
                     fStack_3888 + 0.3333333) * fStack_3888 * fStack_3888 * fStack_3888;
      fStack_3a04 = fStack_3884 + 0.3333333 + -0.00021219444;
      auVar28._4_4_ = fStack_389c * fStack_389c * 0.5;
      auVar28._0_4_ = local_38a0 * local_38a0 * 0.5;
      auVar28._8_4_ = fStack_3898 * fStack_3898 * 0.5;
      auVar28._12_4_ = fStack_3894 * fStack_3894 * 0.5;
      auVar28._16_4_ = fStack_3890 * fStack_3890 * 0.5;
      auVar28._20_4_ = fStack_388c * fStack_388c * 0.5;
      auVar28._24_4_ = fStack_3888 * fStack_3888 * 0.5;
      auVar28._28_4_ = fStack_3884;
      auVar7 = vsubps_avx(_local_3a20,auVar28);
      local_3900 = auVar7._0_4_;
      fStack_38fc = auVar7._4_4_;
      fStack_38f8 = auVar7._8_4_;
      fStack_38f4 = auVar7._12_4_;
      fStack_38f0 = auVar7._16_4_;
      fStack_38ec = auVar7._20_4_;
      fStack_38e8 = auVar7._24_4_;
      fStack_38e4 = auVar7._28_4_;
      local_3920._4_4_ = fStack_2b7c * 0.6933594 + fStack_389c + fStack_38fc;
      local_3920._0_4_ = local_2b80 * 0.6933594 + local_38a0 + local_3900;
      fStack_3918 = fStack_2b78 * 0.6933594 + fStack_3898 + fStack_38f8;
      fStack_3914 = fStack_2b74 * 0.6933594 + fStack_3894 + fStack_38f4;
      uStack_3910._0_4_ = fStack_2b70 * 0.6933594 + fStack_3890 + fStack_38f0;
      uStack_3910._4_4_ = fStack_2b6c * 0.6933594 + fStack_388c + fStack_38ec;
      uStack_3908._0_4_ = fStack_2b68 * 0.6933594 + fStack_3888 + fStack_38e8;
      uStack_3908._4_4_ = fStack_3884 + fStack_38e4 + 0.6933594;
      auVar7 = _local_3920;
      uStack_3908 = auVar7._24_8_;
      auVar39._16_8_ = uStack_3910;
      auVar39._0_16_ = _local_3920;
      auVar39._24_8_ = uStack_3908;
      auVar7 = vorps_avx(auVar39,auVar6);
      local_3f60 = auVar7._0_4_;
      fStack_3f5c = auVar7._4_4_;
      fStack_3f58 = auVar7._8_4_;
      fStack_3f54 = auVar7._12_4_;
      fStack_3f50 = auVar7._16_4_;
      fStack_3f4c = auVar7._20_4_;
      fStack_3f48 = auVar7._24_4_;
      local_3e40._4_4_ = fVar67 * fStack_3f5c;
      local_3e40._0_4_ = fVar67 * local_3f60;
      fStack_3e38 = fVar67 * fStack_3f58;
      fStack_3e34 = fVar67 * fStack_3f54;
      uStack_3e30._0_4_ = uStack_3e28._4_4_ * fStack_3f50;
      uStack_3e30._4_4_ = uStack_3e28._4_4_ * fStack_3f4c;
      uStack_3e28._0_4_ = uStack_3e28._4_4_ * fStack_3f48;
      auVar7 = _local_3e40;
      uStack_3e28 = auVar7._24_8_;
      auVar15._16_8_ = uStack_3e30;
      auVar15._0_16_ = _local_3e40;
      auVar15._24_8_ = uStack_3e28;
      auVar7._8_8_ = 0x42b0c0a542b0c0a5;
      auVar7._0_8_ = 0x42b0c0a542b0c0a5;
      auVar7._16_8_ = 0x42b0c0a542b0c0a5;
      auVar7._24_8_ = 0x42b0c0a542b0c0a5;
      auVar7 = vminps_avx(auVar15,auVar7);
      auVar3._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar3._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar3._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar3._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar3 = vmaxps_avx(auVar7,auVar3);
      local_1dc0 = auVar3._0_4_;
      fStack_1dbc = auVar3._4_4_;
      fStack_1db8 = auVar3._8_4_;
      fStack_1db4 = auVar3._12_4_;
      fStack_1db0 = auVar3._16_4_;
      fStack_1dac = auVar3._20_4_;
      fStack_1da8 = auVar3._24_4_;
      local_3e80._4_4_ = fStack_1dbc * 1.442695 + 0.5;
      local_3e80._0_4_ = local_1dc0 * 1.442695 + 0.5;
      fStack_3e78 = fStack_1db8 * 1.442695 + 0.5;
      fStack_3e74 = fStack_1db4 * 1.442695 + 0.5;
      fStack_3e70 = fStack_1db0 * 1.442695 + 0.5;
      fStack_3e6c = fStack_1dac * 1.442695 + 0.5;
      fStack_3e68 = fStack_1da8 * 1.442695 + 0.5;
      uStack_3e64 = 0x3ff8aa3b;
      auVar6 = vroundps_avx(_local_3e80,1);
      auVar7 = vcmpps_avx(_local_3e80,auVar6,1);
      auVar26._8_8_ = 0x3f8000003f800000;
      auVar26._0_8_ = 0x3f8000003f800000;
      auVar26._16_8_ = 0x3f8000003f800000;
      auVar26._24_8_ = 0x3f8000003f800000;
      auVar7 = vandps_avx(auVar7,auVar26);
      auVar7 = vsubps_avx(auVar6,auVar7);
      local_1800 = auVar7._0_4_;
      fStack_17fc = auVar7._4_4_;
      fStack_17f8 = auVar7._8_4_;
      fStack_17f4 = auVar7._12_4_;
      fStack_17f0 = auVar7._16_4_;
      fStack_17ec = auVar7._20_4_;
      fStack_17e8 = auVar7._24_4_;
      fStack_17e4 = auVar7._28_4_;
      auVar32._4_4_ = fStack_17fc * 0.6933594;
      auVar32._0_4_ = local_1800 * 0.6933594;
      auVar32._8_4_ = fStack_17f8 * 0.6933594;
      auVar32._12_4_ = fStack_17f4 * 0.6933594;
      auVar32._16_4_ = fStack_17f0 * 0.6933594;
      auVar32._20_4_ = fStack_17ec * 0.6933594;
      auVar32._24_4_ = fStack_17e8 * 0.6933594;
      auVar32._28_4_ = fStack_17e4;
      auVar7 = vsubps_avx(auVar3,auVar32);
      auVar31._4_4_ = fStack_17fc * -0.00021219444;
      auVar31._0_4_ = local_1800 * -0.00021219444;
      auVar31._8_4_ = fStack_17f8 * -0.00021219444;
      auVar31._12_4_ = fStack_17f4 * -0.00021219444;
      auVar31._16_4_ = fStack_17f0 * -0.00021219444;
      auVar31._20_4_ = fStack_17ec * -0.00021219444;
      auVar31._24_4_ = fStack_17e8 * -0.00021219444;
      auVar31._28_4_ = fStack_17e4;
      auVar7 = vsubps_avx(auVar7,auVar31);
      local_3d40 = auVar7._0_4_;
      fStack_3d3c = auVar7._4_4_;
      fStack_3d38 = auVar7._8_4_;
      fStack_3d34 = auVar7._12_4_;
      fStack_3d30 = auVar7._16_4_;
      fStack_3d2c = auVar7._20_4_;
      fStack_3d28 = auVar7._24_4_;
      fStack_3d24 = auVar7._28_4_;
      local_3ea0 = CONCAT44((int)fStack_17fc,(int)local_1800);
      uStack_3e98 = CONCAT44((int)fStack_17f4,(int)fStack_17f8);
      uStack_3e90 = CONCAT44((int)fStack_17ec,(int)fStack_17f0);
      uStack_3e88 = CONCAT44((int)fStack_17e4,(int)fStack_17e8);
      auVar36._8_8_ = uStack_3e98;
      auVar36._0_8_ = local_3ea0;
      auVar35._8_8_ = 0x7f0000007f;
      auVar35._0_8_ = 0x7f0000007f;
      auVar11 = vpaddd_avx(auVar36,auVar35);
      auVar34._8_8_ = uStack_3e88;
      auVar34._0_8_ = uStack_3e90;
      auVar33._8_8_ = 0x7f0000007f;
      auVar33._0_8_ = 0x7f0000007f;
      auVar12 = vpaddd_avx(auVar34,auVar33);
      auVar11 = vpslld_avx(auVar11,ZEXT416(0x17));
      auVar12 = vpslld_avx(auVar12,ZEXT416(0x17));
      local_3da0 = auVar11._0_4_;
      fStack_3d9c = auVar11._4_4_;
      fStack_3d98 = auVar11._8_4_;
      fStack_3d94 = auVar11._12_4_;
      fStack_3d90 = auVar12._0_4_;
      fStack_3d8c = auVar12._4_4_;
      fStack_3d88 = auVar12._8_4_;
      local_3f00 = CONCAT44(((((((fStack_3d3c * 0.00019875691 + 0.0013981999) * fStack_3d3c +
                                0.008333452) * fStack_3d3c + 0.041665796) * fStack_3d3c + 0.16666666
                              ) * fStack_3d3c + 0.5) * fStack_3d3c * fStack_3d3c + fStack_3d3c + 1.0
                            ) * fStack_3d9c,
                            ((((((local_3d40 * 0.00019875691 + 0.0013981999) * local_3d40 +
                                0.008333452) * local_3d40 + 0.041665796) * local_3d40 + 0.16666666)
                              * local_3d40 + 0.5) * local_3d40 * local_3d40 + local_3d40 + 1.0) *
                            local_3da0);
      uStack_3ef8 = CONCAT44(((((((fStack_3d34 * 0.00019875691 + 0.0013981999) * fStack_3d34 +
                                 0.008333452) * fStack_3d34 + 0.041665796) * fStack_3d34 +
                               0.16666666) * fStack_3d34 + 0.5) * fStack_3d34 * fStack_3d34 +
                              fStack_3d34 + 1.0) * fStack_3d94,
                             ((((((fStack_3d38 * 0.00019875691 + 0.0013981999) * fStack_3d38 +
                                 0.008333452) * fStack_3d38 + 0.041665796) * fStack_3d38 +
                               0.16666666) * fStack_3d38 + 0.5) * fStack_3d38 * fStack_3d38 +
                              fStack_3d38 + 1.0) * fStack_3d98);
      uStack_3ef0 = CONCAT44(((((((fStack_3d2c * 0.00019875691 + 0.0013981999) * fStack_3d2c +
                                 0.008333452) * fStack_3d2c + 0.041665796) * fStack_3d2c +
                               0.16666666) * fStack_3d2c + 0.5) * fStack_3d2c * fStack_3d2c +
                              fStack_3d2c + 1.0) * fStack_3d8c,
                             ((((((fStack_3d30 * 0.00019875691 + 0.0013981999) * fStack_3d30 +
                                 0.008333452) * fStack_3d30 + 0.041665796) * fStack_3d30 +
                               0.16666666) * fStack_3d30 + 0.5) * fStack_3d30 * fStack_3d30 +
                              fStack_3d30 + 1.0) * fStack_3d90);
      uStack_3ee8 = CONCAT44(fStack_3d24 + fStack_3d24 + 1.0,
                             ((((((fStack_3d28 * 0.00019875691 + 0.0013981999) * fStack_3d28 +
                                 0.008333452) * fStack_3d28 + 0.041665796) * fStack_3d28 +
                               0.16666666) * fStack_3d28 + 0.5) * fStack_3d28 * fStack_3d28 +
                              fStack_3d28 + 1.0) * fStack_3d88);
      *local_4200 = local_3f00;
      local_4200[1] = uStack_3ef8;
      local_4200[2] = uStack_3ef0;
      local_4200[3] = uStack_3ee8;
      local_41f8 = local_41f8 + 2;
      local_4200 = local_4200 + 4;
    }
    for (; local_4284 < in_ECX; local_4284 = local_4284 + 1) {
      fVar67 = *local_41f8;
      auVar4 = vcmpps_avx(auVar10,ZEXT816(0),2);
      auVar52._8_8_ = 0x80000000800000;
      auVar52._0_8_ = 0x80000000800000;
      auVar5 = vmaxps_avx(auVar9,auVar52);
      auVar11 = vpsrld_avx(auVar5,ZEXT416(0x17));
      auVar57._8_8_ = 0x807fffff807fffff;
      auVar57._0_8_ = 0x807fffff807fffff;
      auVar5 = vpand_avx(auVar5,auVar57);
      auVar63._8_8_ = 0x3f0000003f000000;
      auVar63._0_8_ = 0x3f0000003f000000;
      auVar12 = vpor_avx(auVar5,auVar63);
      auVar53._8_8_ = 0x7f0000007f;
      auVar53._0_8_ = 0x7f0000007f;
      auVar5 = vpsubd_avx(auVar11,auVar53);
      auVar5 = vcvtdq2ps_avx(auVar5);
      local_a00 = auVar5._0_4_;
      fStack_9fc = auVar5._4_4_;
      fStack_9f8 = auVar5._8_4_;
      fStack_9f4 = auVar5._12_4_;
      local_aa0 = CONCAT44(fStack_9fc + 1.0,local_a00 + 1.0);
      uStack_a98._0_4_ = fStack_9f8 + 1.0;
      uStack_a98._4_4_ = fStack_9f4 + 1.0;
      auVar64._8_8_ = 0x3f3504f33f3504f3;
      auVar64._0_8_ = 0x3f3504f33f3504f3;
      auVar5 = vcmpps_avx(auVar12,auVar64,1);
      auVar11 = vpand_avx(auVar12,auVar5);
      auVar51._8_8_ = 0x3f8000003f800000;
      auVar51._0_8_ = 0x3f8000003f800000;
      auVar12 = vsubps_avx(auVar12,auVar51);
      auVar56._8_8_ = 0x3f8000003f800000;
      auVar56._0_8_ = 0x3f8000003f800000;
      auVar5 = vpand_avx(auVar56,auVar5);
      auVar50._8_8_ = uStack_a98;
      auVar50._0_8_ = local_aa0;
      auVar5 = vsubps_avx(auVar50,auVar5);
      local_a20 = auVar12._0_4_;
      fStack_a1c = auVar12._4_4_;
      fStack_a18 = auVar12._8_4_;
      fStack_a14 = auVar12._12_4_;
      local_a30 = auVar11._0_4_;
      fStack_a2c = auVar11._4_4_;
      fStack_a28 = auVar11._8_4_;
      fStack_a24 = auVar11._12_4_;
      local_a20 = local_a20 + local_a30;
      fStack_a1c = fStack_a1c + fStack_a2c;
      fStack_a18 = fStack_a18 + fStack_a28;
      fStack_a14 = fStack_a14 + fStack_a24;
      local_620 = auVar5._0_4_;
      fStack_61c = auVar5._4_4_;
      fStack_618 = auVar5._8_4_;
      fStack_614 = auVar5._12_4_;
      local_ae0._4_4_ =
           fStack_61c * -0.00021219444 +
           ((((((((fStack_a1c * 0.070376836 + -0.1151461) * fStack_a1c + 0.116769984) * fStack_a1c +
                -0.12420141) * fStack_a1c + 0.14249323) * fStack_a1c + -0.16668057) * fStack_a1c +
             0.20000714) * fStack_a1c + -0.24999994) * fStack_a1c + 0.3333333) * fStack_a1c *
           fStack_a1c * fStack_a1c;
      local_ae0._0_4_ =
           local_620 * -0.00021219444 +
           ((((((((local_a20 * 0.070376836 + -0.1151461) * local_a20 + 0.116769984) * local_a20 +
                -0.12420141) * local_a20 + 0.14249323) * local_a20 + -0.16668057) * local_a20 +
             0.20000714) * local_a20 + -0.24999994) * local_a20 + 0.3333333) * local_a20 *
           local_a20 * local_a20;
      fStack_ad8 = fStack_618 * -0.00021219444 +
                   ((((((((fStack_a18 * 0.070376836 + -0.1151461) * fStack_a18 + 0.116769984) *
                         fStack_a18 + -0.12420141) * fStack_a18 + 0.14249323) * fStack_a18 +
                      -0.16668057) * fStack_a18 + 0.20000714) * fStack_a18 + -0.24999994) *
                    fStack_a18 + 0.3333333) * fStack_a18 * fStack_a18 * fStack_a18;
      fStack_ad4 = fStack_614 * -0.00021219444 +
                   ((((((((fStack_a14 * 0.070376836 + -0.1151461) * fStack_a14 + 0.116769984) *
                         fStack_a14 + -0.12420141) * fStack_a14 + 0.14249323) * fStack_a14 +
                      -0.16668057) * fStack_a14 + 0.20000714) * fStack_a14 + -0.24999994) *
                    fStack_a14 + 0.3333333) * fStack_a14 * fStack_a14 * fStack_a14;
      auVar59._4_4_ = fStack_a1c * fStack_a1c * 0.5;
      auVar59._0_4_ = local_a20 * local_a20 * 0.5;
      auVar59._8_4_ = fStack_a18 * fStack_a18 * 0.5;
      auVar59._12_4_ = fStack_a14 * fStack_a14 * 0.5;
      auVar5 = vsubps_avx(_local_ae0,auVar59);
      local_a50 = auVar5._0_4_;
      fStack_a4c = auVar5._4_4_;
      fStack_a48 = auVar5._8_4_;
      fStack_a44 = auVar5._12_4_;
      local_a60 = CONCAT44(fStack_61c * 0.6933594 + fStack_a1c + fStack_a4c,
                           local_620 * 0.6933594 + local_a20 + local_a50);
      uStack_a58._0_4_ = fStack_618 * 0.6933594 + fStack_a18 + fStack_a48;
      uStack_a58._4_4_ = fStack_614 * 0.6933594 + fStack_a14 + fStack_a44;
      auVar62._8_8_ = uStack_a58;
      auVar62._0_8_ = local_a60;
      auVar4 = vpor_avx(auVar62,auVar4);
      local_cc0 = auVar4._0_4_;
      fStack_cbc = auVar4._4_4_;
      fStack_cb8 = auVar4._8_4_;
      fStack_cb4 = auVar4._12_4_;
      local_c30 = CONCAT44(fVar67 * fStack_cbc,fVar67 * local_cc0);
      uStack_c28._0_4_ = fVar67 * fStack_cb8;
      uStack_c28._4_4_ = fVar67 * fStack_cb4;
      auVar47._8_8_ = uStack_c28;
      auVar47._0_8_ = local_c30;
      auVar46._8_8_ = 0x42b0c0a542b0c0a5;
      auVar46._0_8_ = 0x42b0c0a542b0c0a5;
      auVar4 = vminps_avx(auVar47,auVar46);
      auVar45._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar45._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar11 = vmaxps_avx(auVar4,auVar45);
      local_b70 = auVar11._0_4_;
      fStack_b6c = auVar11._4_4_;
      fStack_b68 = auVar11._8_4_;
      fStack_b64 = auVar11._12_4_;
      fVar67 = local_b70 * 1.442695 + 0.5;
      fVar68 = fStack_b6c * 1.442695 + 0.5;
      fVar69 = fStack_b68 * 1.442695 + 0.5;
      fVar70 = fStack_b64 * 1.442695 + 0.5;
      local_c50 = CONCAT44(fVar68,fVar67);
      uStack_c48._0_4_ = fVar69;
      uStack_c48._4_4_ = fVar70;
      local_c60 = CONCAT44((int)fVar68,(int)fVar67);
      uStack_c58._0_4_ = (int)fVar69;
      uStack_c58._4_4_ = (int)fVar70;
      auVar54._8_8_ = uStack_c58;
      auVar54._0_8_ = local_c60;
      auVar5 = vcvtdq2ps_avx(auVar54);
      auVar55._8_8_ = uStack_c48;
      auVar55._0_8_ = local_c50;
      auVar4 = vcmpps_avx(auVar55,auVar5,1);
      auVar58._8_8_ = 0x3f8000003f800000;
      auVar58._0_8_ = 0x3f8000003f800000;
      auVar4 = vpand_avx(auVar4,auVar58);
      auVar4 = vsubps_avx(auVar5,auVar4);
      local_6e0 = auVar4._0_4_;
      fStack_6dc = auVar4._4_4_;
      fStack_6d8 = auVar4._8_4_;
      fStack_6d4 = auVar4._12_4_;
      auVar61._4_4_ = fStack_6dc * 0.6933594;
      auVar61._0_4_ = local_6e0 * 0.6933594;
      auVar61._8_4_ = fStack_6d8 * 0.6933594;
      auVar61._12_4_ = fStack_6d4 * 0.6933594;
      auVar4 = vsubps_avx(auVar11,auVar61);
      auVar60._4_4_ = fStack_6dc * -0.00021219444;
      auVar60._0_4_ = local_6e0 * -0.00021219444;
      auVar60._8_4_ = fStack_6d8 * -0.00021219444;
      auVar60._12_4_ = fStack_6d4 * -0.00021219444;
      auVar4 = vsubps_avx(auVar4,auVar60);
      local_b90 = auVar4._0_4_;
      fStack_b8c = auVar4._4_4_;
      fStack_b88 = auVar4._8_4_;
      fStack_b84 = auVar4._12_4_;
      local_c60 = CONCAT44((int)fStack_6dc,(int)local_6e0);
      uStack_c58._0_4_ = (int)fStack_6d8;
      uStack_c58._4_4_ = (int)fStack_6d4;
      auVar49._8_8_ = uStack_c58;
      auVar49._0_8_ = local_c60;
      auVar48._8_8_ = 0x7f0000007f;
      auVar48._0_8_ = 0x7f0000007f;
      auVar4 = vpaddd_avx(auVar49,auVar48);
      auVar4 = vpslld_avx(auVar4,ZEXT416(0x17));
      local_bc0 = auVar4._0_4_;
      fStack_bbc = auVar4._4_4_;
      fStack_bb8 = auVar4._8_4_;
      fStack_bb4 = auVar4._12_4_;
      local_c90 = CONCAT44(((((((fStack_b8c * 0.00019875691 + 0.0013981999) * fStack_b8c +
                               0.008333452) * fStack_b8c + 0.041665796) * fStack_b8c + 0.16666666) *
                             fStack_b8c + 0.5) * fStack_b8c * fStack_b8c + fStack_b8c + 1.0) *
                           fStack_bbc,
                           ((((((local_b90 * 0.00019875691 + 0.0013981999) * local_b90 + 0.008333452
                               ) * local_b90 + 0.041665796) * local_b90 + 0.16666666) * local_b90 +
                            0.5) * local_b90 * local_b90 + local_b90 + 1.0) * local_bc0);
      uStack_c88 = CONCAT44(((((((fStack_b84 * 0.00019875691 + 0.0013981999) * fStack_b84 +
                                0.008333452) * fStack_b84 + 0.041665796) * fStack_b84 + 0.16666666)
                              * fStack_b84 + 0.5) * fStack_b84 * fStack_b84 + fStack_b84 + 1.0) *
                            fStack_bb4,
                            ((((((fStack_b88 * 0.00019875691 + 0.0013981999) * fStack_b88 +
                                0.008333452) * fStack_b88 + 0.041665796) * fStack_b88 + 0.16666666)
                              * fStack_b88 + 0.5) * fStack_b88 * fStack_b88 + fStack_b88 + 1.0) *
                            fStack_bb8);
      *local_4200 = local_c90;
      local_4200[1] = uStack_c88;
      local_41f8 = local_41f8 + 1;
      local_4200 = local_4200 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_a(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        __m512 _p = _mm512_loadu_ps(ptr);
        for (; i < w; i++)
        {
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
        __m256 _p = _mm256_loadu_ps(ptr);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p), _p, 1);
        for (; i + 1 < w; i += 2)
        {
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
        __m128 _p = _mm_loadu_ps(ptr);
#if __AVX__
        __m256 _p_256 = _mm256_insertf128_ps(_mm256_castps128_ps256(_p), _p, 1);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p_256), _p_256, 1);
        for (; i + 3 < w; i += 4)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p_256, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}